

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDVertex::IsSharp(ON_SubDVertex *this,bool bEndCheck)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  ON_SubDEdge *this_00;
  unsigned_short vei;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = false;
  if ((this->m_vertex_tag < 5) && (bVar5 = false, (0x16U >> (this->m_vertex_tag & 0x1f) & 1) != 0))
  {
    pOVar2 = this->m_edges;
    if (pOVar2 == (ON_SubDEdgePtr *)0x0) {
      bVar5 = false;
    }
    else {
      uVar1 = this->m_edge_count;
      for (uVar4 = 0; bVar5 = uVar1 != uVar4, bVar5; uVar4 = uVar4 + 1) {
        this_00 = (ON_SubDEdge *)(pOVar2[uVar4].m_ptr & 0xfffffffffffffff8);
        if ((this_00 != (ON_SubDEdge *)0x0) && (bVar3 = ON_SubDEdge::IsSharp(this_00), bVar3)) {
          return bVar5;
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool ON_SubDVertex::IsSmoothOrDartOrCrease() const
{
  return (ON_SubDVertexTag::Smooth == m_vertex_tag || ON_SubDVertexTag::Dart == m_vertex_tag || ON_SubDVertexTag::Crease == m_vertex_tag);
}